

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O0

FExecList * C_ParseCmdLineParams(FExecList *exec)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  FString local_40 [3];
  int local_28;
  uint local_24;
  int argstart;
  int cmdlen;
  FString cmdString;
  FExecList *pFStack_10;
  int currArg;
  FExecList *exec_local;
  
  cmdString.Chars._4_4_ = 1;
  pFStack_10 = exec;
  while (iVar2 = cmdString.Chars._4_4_, iVar4 = DArgs::NumArgs(Args), iVar5 = cmdString.Chars._4_4_,
        iVar2 < iVar4) {
    cmdString.Chars._4_4_ = cmdString.Chars._4_4_ + 1;
    pcVar6 = DArgs::GetArg(Args,iVar5);
    if (*pcVar6 == '+') {
      FString::FString((FString *)&argstart);
      local_24 = 1;
      local_28 = cmdString.Chars._4_4_ + -1;
      while (((iVar2 = cmdString.Chars._4_4_, iVar5 = DArgs::NumArgs(Args), iVar2 < iVar5 &&
              (pcVar6 = DArgs::GetArg(Args,cmdString.Chars._4_4_), *pcVar6 != '-')) &&
             (pcVar6 = DArgs::GetArg(Args,cmdString.Chars._4_4_), *pcVar6 != '+'))) {
        cmdString.Chars._4_4_ = cmdString.Chars._4_4_ + 1;
        local_24 = local_24 + 1;
      }
      uVar1 = local_24;
      DArgs::GetArgList(Args,local_28);
      BuildString((int)local_40,(FString *)(ulong)uVar1);
      FString::operator=((FString *)&argstart,local_40);
      FString::~FString(local_40);
      bVar3 = FString::IsEmpty((FString *)&argstart);
      if (!bVar3) {
        if (pFStack_10 == (FExecList *)0x0) {
          pFStack_10 = (FExecList *)operator_new(0x20);
          FExecList::FExecList(pFStack_10);
        }
        pcVar6 = FString::operator[]((FString *)&argstart,1);
        FExecList::AddCommand(pFStack_10,pcVar6,(char *)0x0);
      }
      FString::~FString((FString *)&argstart);
    }
  }
  return pFStack_10;
}

Assistant:

FExecList *C_ParseCmdLineParams(FExecList *exec)
{
	for (int currArg = 1; currArg < Args->NumArgs(); )
	{
		if (*Args->GetArg (currArg++) == '+')
		{
			FString cmdString;
			int cmdlen = 1;
			int argstart = currArg - 1;

			while (currArg < Args->NumArgs())
			{
				if (*Args->GetArg (currArg) == '-' || *Args->GetArg (currArg) == '+')
					break;
				currArg++;
				cmdlen++;
			}

			cmdString = BuildString (cmdlen, Args->GetArgList (argstart));
			if (!cmdString.IsEmpty())
			{
				if (exec == NULL)
				{
					exec = new FExecList;
				}
				exec->AddCommand(&cmdString[1]);
			}
		}
	}
	return exec;
}